

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_io.c
# Opt level: O0

int CVodeGetQuadSensStats(void *cvode_mem,long *nfQSevals,long *nQSetfails)

{
  long *in_RDX;
  long *in_RSI;
  CVodeMem in_RDI;
  CVodeMem cv_mem;
  int local_4;
  
  if (in_RDI == (CVodeMem)0x0) {
    cvProcessError((CVodeMem)0x0,-0x15,0x829,"CVodeGetQuadSensStats",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_io.c"
                   ,"cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RDI->cv_quadr_sensi == 0) {
    cvProcessError(in_RDI,-0x32,0x831,"CVodeGetQuadSensStats",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_io.c"
                   ,"Forward sensitivity analysis for quadrature variables not activated.");
    local_4 = -0x32;
  }
  else {
    *in_RSI = in_RDI->cv_nfQSe;
    *in_RDX = in_RDI->cv_netfQS;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CVodeGetQuadSensStats(void* cvode_mem, long int* nfQSevals,
                          long int* nQSetfails)
{
  CVodeMem cv_mem;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

  if (cv_mem->cv_quadr_sensi == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_QUADSENS, __LINE__, __func__, __FILE__,
                   MSGCV_NO_QUADSENSI);
    return (CV_NO_QUADSENS);
  }

  *nfQSevals  = cv_mem->cv_nfQSe;
  *nQSetfails = cv_mem->cv_netfQS;

  return (CV_SUCCESS);
}